

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O0

void __thiscall multisig_tests::multisig_Sign::test_method(multisig_Sign *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int i_2;
  CMutableTransaction txFrom;
  SignatureData empty;
  CMutableTransaction txTo [3];
  CScript escrow;
  CScript a_or_b;
  CScript a_and_b;
  CKey key [4];
  FillableSigningProvider keystore;
  SignatureData *in_stack_fffffffffffff418;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  assertion_result *in_stack_fffffffffffff428;
  size_type in_stack_fffffffffffff430;
  CMutableTransaction *in_stack_fffffffffffff438;
  FillableSigningProvider *in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff448;
  opcodetype in_stack_fffffffffffff44c;
  int in_stack_fffffffffffff450;
  uint in_stack_fffffffffffff454;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff458;
  CTransaction *in_stack_fffffffffffff460;
  SigningProvider *in_stack_fffffffffffff468;
  undefined1 *puVar4;
  undefined1 *local_b90;
  undefined1 *local_b78;
  SignatureData *in_stack_fffffffffffff4a8;
  undefined1 *local_b20;
  undefined1 *local_a68;
  uint32_t local_a60;
  int iVar5;
  const_string local_a40;
  lazy_ostream local_a30 [2];
  assertion_result local_a10 [2];
  int local_9d4;
  const_string local_880 [2];
  lazy_ostream local_860 [2];
  assertion_result local_840 [47];
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [168];
  undefined1 auStack_310 [568];
  undefined1 local_d8 [64];
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff418);
  local_a68 = local_d8;
  do {
    CKey::CKey((CKey *)in_stack_fffffffffffff418);
    local_a68 = local_a68 + 0x10;
  } while (local_a68 != local_98);
  for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
    CKey::MakeNewKey((CKey *)in_stack_fffffffffffff428,(bool)in_stack_fffffffffffff427);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (unsigned_long)in_stack_fffffffffffff418);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff458._M_extent_value,
                 (const_string *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                 CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
                 (const_string *)in_stack_fffffffffffff440);
      FillableSigningProvider::AddKey(in_stack_fffffffffffff440,(CKey *)in_stack_fffffffffffff438);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff428,(bool)in_stack_fffffffffffff427);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (unsigned_long)in_stack_fffffffffffff418);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff418);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (unsigned_long)in_stack_fffffffffffff418);
      in_stack_fffffffffffff418 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_840,local_860,local_880,0xbf,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff418);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff418);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  CScript::CScript((CScript *)in_stack_fffffffffffff418);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_00._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_00._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_00._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_00);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  CScript::CScript((CScript *)in_stack_fffffffffffff418);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_01._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_01._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_01._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_01);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_02._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_02._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_02._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_02);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  CScript::CScript((CScript *)in_stack_fffffffffffff418);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_03._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_03._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_03._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_03);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_04._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_04._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_04._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_04);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff440);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff458._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff428,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  b_05._M_ptr._4_4_ = in_stack_fffffffffffff454;
  b_05._M_ptr._0_4_ = in_stack_fffffffffffff450;
  b_05._M_extent._M_extent_value = in_stack_fffffffffffff458._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff438,b_05);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                      in_stack_fffffffffffff44c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff428);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff438,
             in_stack_fffffffffffff430);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff428,
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  CScript::operator=((CScript *)in_stack_fffffffffffff428,
                     (CScript *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff428,
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  CScript::operator=((CScript *)in_stack_fffffffffffff428,
                     (CScript *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff428,
             CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  CScript::operator=((CScript *)in_stack_fffffffffffff428,
                     (CScript *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
  local_b20 = local_3b8;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
    local_b20 = local_b20 + 0x38;
  } while (local_b20 != auStack_310);
  for (local_a60 = 0; (int)local_a60 < 3; local_a60 = local_a60 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&in_stack_fffffffffffff438->vin,in_stack_fffffffffffff430);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff438,
               in_stack_fffffffffffff430);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff428,
                        CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
    (pvVar2->prevout).n = local_a60;
    CMutableTransaction::GetHash(in_stack_fffffffffffff438);
    pvVar2 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff428,
                        CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
    *(undefined8 *)(pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_3d8;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         local_3d0;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_3c8;
    *(undefined8 *)((pvVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_3c0;
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff428,
                        CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420));
    pvVar3->nValue = 1;
  }
  for (local_9d4 = 0; local_9d4 < 3; local_9d4 = local_9d4 + 1) {
    SignatureData::SignatureData(in_stack_fffffffffffff4a8);
    do {
      in_stack_fffffffffffff4a8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (unsigned_long)in_stack_fffffffffffff418);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff418);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff458._M_extent_value,
                 (const_string *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
                 CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
                 (const_string *)in_stack_fffffffffffff440);
      CTransaction::CTransaction
                ((CTransaction *)in_stack_fffffffffffff458._M_extent_value,
                 (CMutableTransaction *)
                 CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450));
      SignSignature(in_stack_fffffffffffff468,in_stack_fffffffffffff460,
                    (CMutableTransaction *)in_stack_fffffffffffff458._M_extent_value,
                    in_stack_fffffffffffff454,in_stack_fffffffffffff450,
                    (SignatureData *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffff428,(bool)in_stack_fffffffffffff427);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                ((char *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448),
                 (int *)in_stack_fffffffffffff440);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff418);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff428,
                 (pointer)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
                 (unsigned_long)in_stack_fffffffffffff418);
      in_stack_fffffffffffff418 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_a10,local_a30,&local_a40,0xde,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff418);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff418);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff418);
      CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff418);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    SignatureData::~SignatureData(in_stack_fffffffffffff418);
  }
  local_b78 = auStack_310;
  do {
    local_b78 = local_b78 + -0x38;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
  } while (local_b78 != local_3b8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff418);
  CScript::~CScript((CScript *)in_stack_fffffffffffff418);
  CScript::~CScript((CScript *)in_stack_fffffffffffff418);
  CScript::~CScript((CScript *)in_stack_fffffffffffff418);
  puVar4 = local_d8;
  local_b90 = local_98;
  do {
    local_b90 = local_b90 + -0x10;
    CKey::~CKey((CKey *)in_stack_fffffffffffff418);
  } while (local_b90 != puVar4);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff418);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_Sign)
{
    // Test SignSignature() (and therefore the version of Solver() that signs transactions)
    FillableSigningProvider keystore;
    CKey key[4];
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b  << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    for (int i = 0; i < 3; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
    }
}